

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O1

Reg __thiscall
backend::codegen::RegAllocator::alloc_transient_reg
          (RegAllocator *this,Interval i,optional<unsigned_int> orig)

{
  _Rb_tree_header *p_Var1;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *plVar2;
  size_t *psVar3;
  Reg *pRVar4;
  ConditionCode CVar5;
  uint uVar6;
  _List_node_base *p_Var7;
  _Base_ptr p_Var8;
  ulong uVar9;
  __node_base_ptr p_Var10;
  _Hash_node_base *p_Var11;
  size_t sVar12;
  key_type kVar13;
  ostream *poVar14;
  _List_node_base *p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  mapped_type *pmVar18;
  _func_int **pp_Var19;
  __node_base_ptr p_Var20;
  _Optional_payload_base<unsigned_int> _Var21;
  _List_node_base *p_Var22;
  ostream *poVar23;
  runtime_error *this_00;
  __hash_code __code_2;
  _Rb_tree_header *p_Var24;
  _Base_ptr p_Var25;
  ulong uVar26;
  ulong uVar27;
  _Optional_payload_base<unsigned_int> _Var28;
  __node_base_ptr p_Var29;
  __node_base *p_Var30;
  char *pcVar31;
  Tag *pTVar32;
  uint *puVar33;
  __hash_code __code_1;
  _Variadic_union<arm::RegisterOperand,_short> *p_Var34;
  __hash_code __code;
  ulong uVar35;
  bool bVar36;
  stringstream ss;
  anon_class_8_1_a78179b7_conflict10 local_278;
  size_type local_270;
  _Variadic_union<arm::RegisterOperand,_short> local_268;
  undefined1 local_258 [36];
  key_type kStack_234;
  undefined **local_230;
  undefined8 local_228;
  _Variadic_union<arm::RegisterOperand,_short> local_220;
  undefined1 local_210;
  undefined1 local_208;
  ostream local_1f9;
  _Optional_payload_base<unsigned_int> local_1f8;
  Interval local_1f0;
  int local_1e4;
  _Head_base<0UL,_arm::LoadStoreInst_*,_false> local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [16];
  _Move_ctor_base<false,_arm::RegisterOperand,_short> local_1a8;
  _Alloc_hider local_190;
  pointer local_188;
  char local_180;
  undefined7 uStack_17f;
  undefined8 uStack_178;
  size_t local_170;
  bool local_168;
  
  local_1f0 = i;
  if (((ulong)orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
    stack0xfffffffffffffdc8 = stack0xfffffffffffffdc8 & 0xffffffffffffff00;
    AixLog::operator<<((ostream *)(local_258 + 0x20),(Severity *)i);
    local_228 = &local_220._M_first._M_storage.reg;
    local_230 = &PTR__Tag_001edee0;
    local_220._M_first._M_storage.super_Displayable._vptr_Displayable =
         (Displayable)(_func_int **)0x0;
    local_220._M_first._M_storage.reg._0_1_ = 0;
    local_208 = 1;
    AixLog::operator<<((ostream *)&local_230,(Tag *)i);
    local_1d8 = std::chrono::_V2::system_clock::now();
    local_1e0._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
    local_1d0 = 0;
    AixLog::operator<<((ostream *)&local_1e0,(Timestamp *)i);
    local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"alloc_transient_reg","");
    pp_Var19 = (_func_int **)(local_258 + 0x10);
    pcVar31 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_258._0_8_ = pp_Var19;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,"");
    local_1b8._0_4_ = 0x1edf10;
    local_1b8._4_4_ = 0;
    local_1b8._8_8_ = local_278.__lhs;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_278.__lhs == &local_268) {
      local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._16_8_ = local_268._8_8_;
      local_1b8._8_8_ = (undefined1 *)((long)&local_1a8 + 8);
    }
    local_190._M_p = &local_180;
    local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(Displayable)local_270;
    local_270 = 0;
    local_268._M_rest._M_first._M_storage._0_1_ = 0;
    if ((_func_int **)local_258._0_8_ == pp_Var19) {
      uStack_178 = local_258._24_8_;
    }
    else {
      local_190._M_p = (pointer)local_258._0_8_;
    }
    local_188 = (pointer)local_258._8_8_;
    local_258._8_8_ = (pointer)0x0;
    local_258[0x10] = 0;
    local_170 = 0x1f6;
    local_168 = false;
    local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_268;
    local_258._0_8_ = pp_Var19;
    AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar31);
    pcVar31 = "orig ";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"orig ",5);
    AixLog::Function::~Function((Function *)local_1b8);
    if ((_func_int **)local_258._0_8_ != pp_Var19) {
      pcVar31 = (char *)(CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
      operator_delete((void *)local_258._0_8_,(ulong)pcVar31);
    }
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_278.__lhs != &local_268) {
      pcVar31 = (char *)(CONCAT71(local_268._1_7_,local_268._M_rest._M_first._M_storage._0_1_) + 1);
      operator_delete(local_278.__lhs,(ulong)pcVar31);
    }
    local_230 = &PTR__Tag_001edee0;
    if (local_228 != &local_220._M_first._M_storage.reg) {
      pcVar31 = (char *)(CONCAT71(local_220._9_7_,local_220._M_first._M_storage.reg._0_1_) + 1);
      operator_delete(local_228,(ulong)pcVar31);
    }
    stack0xfffffffffffffdc8 = stack0xfffffffffffffdc8 & 0xffffffffffffff00;
    AixLog::operator<<((ostream *)(local_258 + 0x20),(Severity *)pcVar31);
    local_230 = &PTR__Tag_001edee0;
    local_228 = &local_220._M_first._M_storage.reg;
    local_220._M_first._M_storage.super_Displayable._vptr_Displayable =
         (Displayable)(_func_int **)0x0;
    local_220._M_first._M_storage.reg._0_1_ = 0;
    local_208 = 1;
    AixLog::operator<<((ostream *)&local_230,(Tag *)pcVar31);
    local_1d8 = std::chrono::_V2::system_clock::now();
    local_1e0._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
    local_1d0 = 0;
    AixLog::operator<<((ostream *)&local_1e0,(Timestamp *)pcVar31);
    local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"alloc_transient_reg","");
    pcVar31 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_258._0_8_ = pp_Var19;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,"");
    local_1b8._0_4_ = 0x1edf10;
    local_1b8._4_4_ = 0;
    local_190._M_p = &local_180;
    local_1b8._8_8_ = local_278.__lhs;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_278.__lhs == &local_268) {
      local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._16_8_ = local_268._8_8_;
      local_1b8._8_8_ = (undefined1 *)((long)&local_1a8 + 8);
    }
    local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._9_7_ = local_268._1_7_;
    local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._8_1_ = local_268._M_rest._0_1_;
    local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(Displayable)local_270;
    local_270 = 0;
    local_268._M_rest._M_first._M_storage._0_1_ = 0;
    if ((_func_int **)local_258._0_8_ == pp_Var19) {
      uStack_178 = local_258._24_8_;
    }
    else {
      local_190._M_p = (pointer)local_258._0_8_;
    }
    uStack_17f = local_258._17_7_;
    local_180 = local_258[0x10];
    local_188 = (pointer)local_258._8_8_;
    local_258._8_8_ = (pointer)0x0;
    local_258[0x10] = 0;
    local_170 = 0x1f7;
    local_168 = false;
    local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_268;
    local_258._0_8_ = pp_Var19;
    AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar31);
    pTVar32 = (Tag *)((ulong)orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_int> & 0xffffffff);
    arm::display_reg_name
              ((ostream *)&std::clog,
               orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload);
    AixLog::Function::~Function((Function *)local_1b8);
    if ((_func_int **)local_258._0_8_ != pp_Var19) {
      pTVar32 = (Tag *)(CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
      operator_delete((void *)local_258._0_8_,(ulong)pTVar32);
    }
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_278.__lhs != &local_268) {
      pTVar32 = (Tag *)(CONCAT71(local_268._1_7_,local_268._M_rest._M_first._M_storage._0_1_) + 1);
      operator_delete(local_278.__lhs,(ulong)pTVar32);
    }
    local_230 = &PTR__Tag_001edee0;
    if (local_228 != &local_220._M_first._M_storage.reg) {
      pTVar32 = (Tag *)(CONCAT71(local_220._9_7_,local_220._M_first._M_storage.reg._0_1_) + 1);
      operator_delete(local_228,(ulong)pTVar32);
    }
    stack0xfffffffffffffdc8 = stack0xfffffffffffffdc8 & 0xffffffffffffff00;
    AixLog::operator<<((ostream *)(local_258 + 0x20),(Severity *)pTVar32);
    local_230 = &PTR__Tag_001edee0;
    local_228 = &local_220._M_first._M_storage.reg;
    local_220._M_first._M_storage.super_Displayable._vptr_Displayable =
         (Displayable)(_func_int **)0x0;
    local_220._M_first._M_storage.reg._0_1_ = 0;
    local_208 = 1;
    AixLog::operator<<((ostream *)&local_230,pTVar32);
    local_1d8 = std::chrono::_V2::system_clock::now();
    local_1e0._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
    local_1d0 = 0;
    AixLog::operator<<((ostream *)&local_1e0,(Timestamp *)pTVar32);
    p_Var34 = &local_268;
    local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)p_Var34;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"alloc_transient_reg","");
    pcVar31 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_258._0_8_ = pp_Var19;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,"");
    local_1b8._0_4_ = 0x1edf10;
    local_1b8._4_4_ = 0;
    local_190._M_p = &local_180;
    local_1b8._8_8_ = local_278.__lhs;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_278.__lhs == p_Var34) {
      local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._16_8_ = local_268._8_8_;
      local_1b8._8_8_ = (undefined1 *)((long)&local_1a8 + 8);
    }
    local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._9_7_ = local_268._1_7_;
    local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._8_1_ = local_268._M_rest._0_1_;
    local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(Displayable)local_270;
    local_270 = 0;
    local_268._M_rest._M_first._M_storage._0_1_ = 0;
    if ((_func_int **)local_258._0_8_ == pp_Var19) {
      uStack_178 = local_258._24_8_;
    }
    else {
      local_190._M_p = (pointer)local_258._0_8_;
    }
    uStack_17f = local_258._17_7_;
    local_180 = local_258[0x10];
    local_188 = (pointer)local_258._8_8_;
    local_258._8_8_ = (pointer)0x0;
    local_258[0x10] = 0;
    local_170 = 0x1f8;
    local_168 = false;
    local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)p_Var34;
    local_258._0_8_ = pp_Var19;
    AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar31);
    pTVar32 = (Tag *)0x1bc552;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," ",1);
    AixLog::Function::~Function((Function *)local_1b8);
    if ((_func_int **)local_258._0_8_ != pp_Var19) {
      pTVar32 = (Tag *)(CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
      operator_delete((void *)local_258._0_8_,(ulong)pTVar32);
    }
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_278.__lhs != p_Var34) {
      pTVar32 = (Tag *)(CONCAT71(local_268._1_7_,local_268._M_rest._M_first._M_storage._0_1_) + 1);
      operator_delete(local_278.__lhs,(ulong)pTVar32);
    }
    local_230 = &PTR__Tag_001edee0;
    if (local_228 != &local_220._M_first._M_storage.reg) {
      pTVar32 = (Tag *)(CONCAT71(local_220._9_7_,local_220._M_first._M_storage.reg._0_1_) + 1);
      operator_delete(local_228,(ulong)pTVar32);
    }
    plVar2 = &this->active_reg_map;
    p_Var22 = (_List_node_base *)plVar2;
    do {
      p_Var22 = (((_List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&p_Var22->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var22 == (_List_node_base *)plVar2) goto LAB_00177da3;
    } while (*(uint *)&p_Var22[1]._M_next !=
             orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload);
    if (p_Var22 != (_List_node_base *)plVar2) {
      stack0xfffffffffffffdc8 = stack0xfffffffffffffdc8 & 0xffffffffffffff00;
      AixLog::operator<<((ostream *)(local_258 + 0x20),(Severity *)pTVar32);
      local_230 = &PTR__Tag_001edee0;
      local_228 = &local_220._M_first._M_storage.reg;
      local_220._M_first._M_storage.super_Displayable._vptr_Displayable =
           (Displayable)(_func_int **)0x0;
      local_220._M_first._M_storage.reg._0_1_ = 0;
      local_208 = 1;
      AixLog::operator<<((ostream *)&local_230,pTVar32);
      local_1d8 = std::chrono::_V2::system_clock::now();
      local_1e0._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
      local_1d0 = 0;
      AixLog::operator<<((ostream *)&local_1e0,(Timestamp *)pTVar32);
      local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_268;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"alloc_transient_reg","")
      ;
      pcVar31 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
      ;
      local_258._0_8_ = pp_Var19;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                 ,"");
      local_1b8._0_4_ = 0x1edf10;
      local_1b8._4_4_ = 0;
      local_1b8._8_8_ = local_278.__lhs;
      if ((_Variadic_union<arm::RegisterOperand,_short> *)local_278.__lhs == &local_268) {
        local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
        super__Variant_storage_alias<arm::RegisterOperand,_short>._16_8_ = local_268._8_8_;
        local_1b8._8_8_ = (undefined1 *)((long)&local_1a8 + 8);
      }
      local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._9_7_ = local_268._1_7_;
      local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._8_1_ = local_268._M_rest._0_1_
      ;
      local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_first._M_storage.
      super_Displayable._vptr_Displayable = (Displayable)(Displayable)local_270;
      local_270 = 0;
      local_268._M_rest._M_first._M_storage._0_1_ = 0;
      local_190._M_p = &local_180;
      if ((_func_int **)local_258._0_8_ == pp_Var19) {
        uStack_178 = local_258._24_8_;
      }
      else {
        local_190._M_p = (pointer)local_258._0_8_;
      }
      uStack_17f = local_258._17_7_;
      local_180 = local_258[0x10];
      local_188 = (pointer)local_258._8_8_;
      local_258._8_8_ = (pointer)0x0;
      local_258[0x10] = 0;
      local_170 = 0x201;
      local_168 = false;
      local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_268;
      local_258._0_8_ = pp_Var19;
      AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar31);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"r-> ",4);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
      AixLog::Function::~Function((Function *)local_1b8);
      if ((_func_int **)local_258._0_8_ != pp_Var19) {
        operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
      }
      if ((_Variadic_union<arm::RegisterOperand,_short> *)local_278.__lhs != &local_268) {
        operator_delete(local_278.__lhs,
                        CONCAT71(local_268._1_7_,local_268._M_rest._M_first._M_storage._0_1_) + 1);
      }
      local_230 = &PTR__Tag_001edee0;
      if (local_228 != &local_220._M_first._M_storage.reg) {
        operator_delete(local_228,
                        CONCAT71(local_220._9_7_,local_220._M_first._M_storage.reg._0_1_) + 1);
      }
      p_Var34 = (_Variadic_union<arm::RegisterOperand,_short> *)
                (ulong)*(uint *)((long)&p_Var22[1]._M_next + 4);
      p_Var7 = p_Var22[1]._M_next;
      psVar3 = &(this->active_reg_map).
                super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl._M_node._M_size;
      *psVar3 = *psVar3 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var22,0x18);
      p_Var15 = (_List_node_base *)operator_new(0x18);
      p_Var15[1]._M_next = p_Var7;
      std::__detail::_List_node_base::_M_hook(p_Var15);
      psVar3 = &(this->active_reg_map).
                super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl._M_node._M_size;
      *psVar3 = *psVar3 + 1;
    }
LAB_00177da3:
    if (p_Var22 != (_List_node_base *)plVar2) {
      return (Reg)p_Var34;
    }
  }
  p_Var16 = &(this->bl_points)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var8 = (this->bl_points)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var25 = p_Var16;
  for (p_Var17 = p_Var8; p_Var17 != (_Base_ptr)0x0;
      p_Var17 = (&p_Var17->_M_left)[(int)p_Var17[1]._M_color < (int)local_1f0.start]) {
    if ((int)local_1f0.start <= (int)p_Var17[1]._M_color) {
      p_Var25 = p_Var17;
    }
  }
  for (; p_Var8 != (_Base_ptr)0x0;
      p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color <= (int)local_1f0.end]) {
    if ((int)local_1f0.end < (int)p_Var8[1]._M_color) {
      p_Var16 = p_Var8;
    }
  }
  p_Var34 = (_Variadic_union<arm::RegisterOperand,_short> *)local_1b8._8_8_;
  if (p_Var25 == p_Var16) {
    if (arm::TEMP_REGS != DAT_001f23f8) {
      uVar9 = (this->active)._M_h._M_bucket_count;
      puVar33 = arm::TEMP_REGS;
      do {
        uVar6 = *puVar33;
        uVar26 = (ulong)uVar6;
        uVar35 = uVar26 % uVar9;
        p_Var10 = (this->active)._M_h._M_buckets[uVar35];
        p_Var20 = (__node_base_ptr)0x0;
        if ((p_Var10 != (__node_base_ptr)0x0) &&
           (p_Var20 = p_Var10, p_Var29 = p_Var10->_M_nxt,
           uVar6 != *(uint *)&p_Var10->_M_nxt[1]._M_nxt)) {
          while (p_Var11 = p_Var29->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
            p_Var20 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var11[1]._M_nxt % uVar9 != uVar35) ||
               (p_Var20 = p_Var29, p_Var29 = p_Var11, uVar6 == *(uint *)&p_Var11[1]._M_nxt))
            goto LAB_00177f78;
          }
          p_Var20 = (__node_base_ptr)0x0;
        }
LAB_00177f78:
        if ((p_Var20 == (__node_base_ptr)0x0) || (p_Var20->_M_nxt == (_Hash_node_base *)0x0))
        goto LAB_00177f91;
        puVar33 = puVar33 + 1;
      } while (puVar33 != DAT_001f23f8);
    }
    uVar26 = 0xffffffff;
LAB_00177f91:
    if (((int)uVar26 == -1) && (arm::GLOB_REGS != DAT_001f2410)) {
      p_Var1 = &(this->used_regs)._M_t._M_impl.super__Rb_tree_header;
      uVar9 = (this->active)._M_h._M_bucket_count;
      local_1f8 = (_Optional_payload_base<unsigned_int>)
                  (this->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      puVar33 = arm::GLOB_REGS;
      do {
        local_1b8._0_4_ = *puVar33;
        uVar27 = (ulong)(uint)local_1b8._0_4_;
        uVar35 = uVar27 % uVar9;
        p_Var10 = (this->active)._M_h._M_buckets[uVar35];
        p_Var20 = (__node_base_ptr)0x0;
        if ((p_Var10 != (__node_base_ptr)0x0) &&
           (p_Var20 = p_Var10, p_Var29 = p_Var10->_M_nxt,
           local_1b8._0_4_ != *(uint *)&p_Var10->_M_nxt[1]._M_nxt)) {
          while (p_Var11 = p_Var29->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
            p_Var20 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var11[1]._M_nxt % uVar9 != uVar35) ||
               (p_Var20 = p_Var29, p_Var29 = p_Var11, local_1b8._0_4_ == *(uint *)&p_Var11[1]._M_nxt
               )) goto LAB_00178387;
          }
          p_Var20 = (__node_base_ptr)0x0;
        }
LAB_00178387:
        _Var21 = (_Optional_payload_base<unsigned_int>)p_Var1;
        _Var28 = local_1f8;
        if ((p_Var20 == (__node_base_ptr)0x0) || (p_Var20->_M_nxt == (_Hash_node_base *)0x0)) {
          for (; _Var28 != (_Optional_payload_base<unsigned_int>)0x0;
              _Var28 = *(_Optional_payload_base<unsigned_int> *)
                        ((long)_Var28 + 0x10 + (ulong)bVar36 * 8)) {
            bVar36 = *(uint *)((long)_Var28 + 0x20) < (uint)local_1b8._0_4_;
            if (!bVar36) {
              _Var21 = _Var28;
            }
          }
          _Var28 = (_Optional_payload_base<unsigned_int>)p_Var1;
          if ((_Var21 != (_Optional_payload_base<unsigned_int>)p_Var1) &&
             (_Var28 = _Var21, (uint)local_1b8._0_4_ < *(uint *)((long)_Var21 + 0x20))) {
            _Var28 = (_Optional_payload_base<unsigned_int>)p_Var1;
          }
          if (_Var28 == (_Optional_payload_base<unsigned_int>)p_Var1) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&this->used_regs_temp,(uint *)local_1b8);
            uVar26 = uVar27;
            p_Var34 = (_Variadic_union<arm::RegisterOperand,_short> *)local_1b8._8_8_;
            break;
          }
        }
        puVar33 = puVar33 + 1;
      } while (puVar33 != DAT_001f2410);
    }
  }
  else {
    if (arm::GLOB_REGS != DAT_001f2410) {
      p_Var1 = &(this->used_regs)._M_t._M_impl.super__Rb_tree_header;
      uVar9 = (this->active)._M_h._M_bucket_count;
      p_Var16 = (this->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      puVar33 = arm::GLOB_REGS;
      do {
        local_1b8._0_4_ = *puVar33;
        uVar35 = (ulong)(uint)local_1b8._0_4_;
        uVar26 = uVar35 % uVar9;
        p_Var10 = (this->active)._M_h._M_buckets[uVar26];
        p_Var20 = (__node_base_ptr)0x0;
        if ((p_Var10 != (__node_base_ptr)0x0) &&
           (p_Var20 = p_Var10, p_Var29 = p_Var10->_M_nxt,
           local_1b8._0_4_ != *(uint *)&p_Var10->_M_nxt[1]._M_nxt)) {
          while (p_Var11 = p_Var29->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
            p_Var20 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var11[1]._M_nxt % uVar9 != uVar26) ||
               (p_Var20 = p_Var29, p_Var29 = p_Var11, local_1b8._0_4_ == *(uint *)&p_Var11[1]._M_nxt
               )) goto LAB_00177ea1;
          }
          p_Var20 = (__node_base_ptr)0x0;
        }
LAB_00177ea1:
        p_Var17 = &p_Var1->_M_header;
        p_Var8 = p_Var16;
        if ((p_Var20 == (__node_base_ptr)0x0) || (p_Var20->_M_nxt == (_Hash_node_base *)0x0)) {
          for (; (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
              p_Var8 = (&p_Var8->_M_left)[bVar36]) {
            bVar36 = (uint)*(size_t *)(p_Var8 + 1) < (uint)local_1b8._0_4_;
            if (!bVar36) {
              p_Var17 = p_Var8;
            }
          }
          p_Var24 = p_Var1;
          if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
             (p_Var24 = (_Rb_tree_header *)p_Var17,
             (uint)local_1b8._0_4_ < (uint)((_Rb_tree_header *)p_Var17)->_M_node_count)) {
            p_Var24 = p_Var1;
          }
          if (p_Var24 == p_Var1) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&this->used_regs_temp,(uint *)local_1b8);
            p_Var34 = (_Variadic_union<arm::RegisterOperand,_short> *)local_1b8._8_8_;
            goto LAB_00177fb0;
          }
        }
        puVar33 = puVar33 + 1;
      } while (puVar33 != DAT_001f2410);
    }
    uVar35 = 0xffffffff;
LAB_00177fb0:
    uVar26 = uVar35;
    if (((int)uVar35 == -1) && (arm::TEMP_REGS != DAT_001f23f8)) {
      uVar9 = (this->active)._M_h._M_bucket_count;
      puVar33 = arm::TEMP_REGS;
      do {
        uVar6 = *puVar33;
        uVar26 = (ulong)uVar6;
        uVar27 = uVar26 % uVar9;
        p_Var10 = (this->active)._M_h._M_buckets[uVar27];
        p_Var20 = (__node_base_ptr)0x0;
        if ((p_Var10 != (__node_base_ptr)0x0) &&
           (p_Var20 = p_Var10, p_Var29 = p_Var10->_M_nxt,
           uVar6 != *(uint *)&p_Var10->_M_nxt[1]._M_nxt)) {
          while (p_Var11 = p_Var29->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
            p_Var20 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var11[1]._M_nxt % uVar9 != uVar27) ||
               (p_Var20 = p_Var29, p_Var29 = p_Var11, uVar6 == *(uint *)&p_Var11[1]._M_nxt))
            goto LAB_001782d3;
          }
          p_Var20 = (__node_base_ptr)0x0;
        }
LAB_001782d3:
      } while (((p_Var20 != (__node_base_ptr)0x0) && (p_Var20->_M_nxt != (_Hash_node_base *)0x0)) &&
              (puVar33 = puVar33 + 1, uVar26 = uVar35, puVar33 != DAT_001f23f8));
    }
  }
  local_1b8._12_4_ = (undefined4)((ulong)p_Var34 >> 0x20);
  if ((int)uVar26 == -1) {
    sVar12 = (this->active_reg_map).
             super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl._M_node._M_size;
    local_1f8 = (_Optional_payload_base<unsigned_int>)
                orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>;
    local_1b8._8_8_ = p_Var34;
    if (sVar12 == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      poVar14 = (ostream *)(local_1b8 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"Failed to allocate: all active registers are temporary!",0x37);
      poVar23 = std::endl<char,std::char_traits<char>>(poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar23,"Dump: ",6);
      std::endl<char,std::char_traits<char>>(poVar23);
      p_Var30 = &(this->active)._M_h._M_before_begin;
      while (p_Var30 = p_Var30->_M_nxt, p_Var30 != (__node_base *)0x0) {
        arm::display_reg_name(poVar14,(Reg)*(size_type *)(p_Var30 + 1));
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": [",3);
        poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
        poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]",1);
        std::endl<char,std::char_traits<char>>(poVar23);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,(string *)&local_230);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    p_Var22 = (this->active_reg_map).
              super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    unique0x00012000 = p_Var22[1]._M_next;
    (this->active_reg_map).
    super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl._M_node._M_size = sVar12 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var22,0x18);
    local_1c8 = &(this->active)._M_h;
    pmVar18 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)local_1c8,&kStack_234);
    local_1c0 = (ulong)pmVar18->end;
    local_1e4 = get_or_alloc_spill_pos(this,local_258._32_4_);
    local_230 = &PTR_display_001f0808;
    local_228._0_4_ = (uint)local_228 & 0xffffff00;
    local_228._4_4_ = 0xd;
    local_220._M_rest = (_Variadic_union<short>)((short)this->stack_offset + (short)local_1e4);
    local_210 = 1;
    pp_Var19 = (_func_int **)operator_new(0x50);
    kVar13 = kStack_234;
    local_1b8._0_4_ = 0x1f0808;
    local_1b8._4_4_ = 0;
    local_1b8._8_4_ = (uint)local_228;
    local_1b8._12_4_ = local_228._4_4_;
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_short>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_short> *)(local_1b8 + 0x10),
               (_Move_ctor_base<false,_arm::RegisterOperand,_short> *)&local_220._M_first);
    local_190._M_p._0_1_ = local_208;
    CVar5 = this->cur_cond;
    *(undefined4 *)(pp_Var19 + 1) = 0x1c;
    *(ConditionCode *)((long)pp_Var19 + 0xc) = CVar5;
    *pp_Var19 = (_func_int *)&PTR_display_001f09c8;
    *(key_type *)(pp_Var19 + 2) = kVar13;
    pp_Var19[3] = (_func_int *)&PTR_display_001f0808;
    pp_Var19[4] = (_func_int *)CONCAT44(local_1b8._12_4_,local_1b8._8_4_);
    local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)(pp_Var19 + 5);
    *(undefined1 *)(pp_Var19 + 7) = 0xff;
    *(__index_type *)(pp_Var19 + 7) =
         local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
         super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_short>_&>
      ::_S_vtable._M_arr
      [(long)(char)local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                   super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index + 1]._M_data)
              (&local_278,(variant<arm::RegisterOperand,_short> *)(local_1b8 + 0x10));
    *(undefined1 *)(pp_Var19 + 8) = local_190._M_p._0_1_;
    *(undefined1 *)(pp_Var19 + 9) = 1;
    local_1e0._M_head_impl = (LoadStoreInst *)0x0;
    pTVar32 = (Tag *)local_258;
    local_258._0_8_ = pp_Var19;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst_sink,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)pTVar32
              );
    orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)local_1f8;
    if ((_func_int **)local_258._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_258._0_8_ + 0x10))();
    }
    local_258._0_8_ = (_func_int **)0x0;
    std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
              ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)
               &local_1e0);
    local_1f9 = (ostream)0x0;
    AixLog::operator<<(&local_1f9,(Severity *)pTVar32);
    pRVar4 = &local_220._M_first._M_storage.reg;
    local_230 = &PTR__Tag_001edee0;
    local_220._M_first._M_storage.super_Displayable._vptr_Displayable =
         (Displayable)(_func_int **)0x0;
    local_220._M_first._M_storage.reg._0_1_ = 0;
    local_208 = 1;
    local_228 = pRVar4;
    AixLog::operator<<((ostream *)&local_230,pTVar32);
    local_1d8 = std::chrono::_V2::system_clock::now();
    local_1e0._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
    local_1d0 = 0;
    AixLog::operator<<((ostream *)&local_1e0,(Timestamp *)pTVar32);
    uVar9 = local_1c0;
    local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"alloc_transient_reg","");
    pp_Var19 = (_func_int **)(local_258 + 0x10);
    pcVar31 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_258._0_8_ = pp_Var19;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,"");
    local_1b8._0_4_ = 0x1edf10;
    local_1b8._4_4_ = 0;
    local_1b8._8_8_ = local_278.__lhs;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_278.__lhs == &local_268) {
      local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._16_8_ = local_268._8_8_;
      local_1b8._8_8_ = (undefined1 *)((long)&local_1a8 + 8);
    }
    local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._9_7_ = local_268._1_7_;
    local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._8_1_ = local_268._M_rest._0_1_;
    local_190._M_p = &local_180;
    local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(Displayable)local_270;
    local_270 = 0;
    local_268._M_rest._M_first._M_storage._0_1_ = 0;
    if ((_func_int **)local_258._0_8_ == pp_Var19) {
      uStack_178 = local_258._24_8_;
    }
    else {
      local_190._M_p = (pointer)local_258._0_8_;
    }
    uStack_17f = local_258._17_7_;
    local_180 = local_258[0x10];
    local_188 = (pointer)local_258._8_8_;
    local_258._8_8_ = (pointer)0x0;
    local_258[0x10] = 0;
    local_170 = 0x247;
    local_168 = false;
    local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_268;
    local_258._0_8_ = pp_Var19;
    AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar31);
    AixLog::Function::~Function((Function *)local_1b8);
    if ((_func_int **)local_258._0_8_ != pp_Var19) {
      operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
    }
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_278.__lhs != &local_268) {
      operator_delete(local_278.__lhs,
                      CONCAT71(local_268._1_7_,local_268._M_rest._M_first._M_storage._0_1_) + 1);
    }
    local_230 = &PTR__Tag_001edee0;
    if (local_228 != pRVar4) {
      operator_delete(local_228,
                      CONCAT71(local_220._9_7_,local_220._M_first._M_storage.reg._0_1_) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Spilling: ",10);
    arm::display_reg_name((ostream *)&std::clog,kStack_234);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," -> ",4);
    arm::display_reg_name((ostream *)&std::clog,local_258._32_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," -> ",4);
    poVar14 = (ostream *)std::ostream::operator<<(&std::clog,local_1e4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
    uVar26 = (ulong)stack0xfffffffffffffdc8 >> 0x20;
    local_1b8._0_4_ = local_258._32_4_;
    local_1b8._4_4_ = local_1f0.start;
    local_1b8._8_4_ = (undefined4)uVar9;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int_const,backend::codegen::Interval>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->spilled_regs);
    p_Var22 = (_List_node_base *)&this->active_reg_map;
    do {
      p_Var22 = (((_List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&p_Var22->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var22 == (_List_node_base *)&this->active_reg_map) goto LAB_001785c4;
    } while ((((ulong)orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) ||
            (*(uint *)&p_Var22[1]._M_next !=
             orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload));
    psVar3 = &(this->active_reg_map).
              super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl._M_node._M_size;
    *psVar3 = *psVar3 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var22,0x18);
LAB_001785c4:
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(local_1c8,&kStack_234);
  }
  pTVar32 = (Tag *)local_1b8;
  local_1b8._4_4_ = local_1f0.start;
  local_1b8._8_4_ = local_1f0.end;
  local_1b8._0_4_ = (Reg)uVar26;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_int_const,backend::codegen::Interval>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->active);
  if (((ulong)orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
    pTVar32 = (Tag *)&this->active_reg_map;
    p_Var22 = (_List_node_base *)operator_new(0x18);
    p_Var22[1]._M_next =
         (_List_node_base *)
         ((ulong)orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int> & 0xffffffff | uVar26 << 0x20);
    std::__detail::_List_node_base::_M_hook(p_Var22);
    psVar3 = &(this->active_reg_map).
              super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl._M_node._M_size;
    *psVar3 = *psVar3 + 1;
  }
  stack0xfffffffffffffdc8 = stack0xfffffffffffffdc8 & 0xffffffffffffff00;
  AixLog::operator<<((ostream *)(local_258 + 0x20),(Severity *)pTVar32);
  pRVar4 = &local_220._M_first._M_storage.reg;
  local_230 = &PTR__Tag_001edee0;
  local_220._M_first._M_storage.super_Displayable._vptr_Displayable = (Displayable)(_func_int **)0x0
  ;
  local_220._M_first._M_storage.reg._0_1_ = 0;
  local_208 = 1;
  local_228 = pRVar4;
  AixLog::operator<<((ostream *)&local_230,pTVar32);
  local_1d8 = std::chrono::_V2::system_clock::now();
  local_1e0._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
  local_1d0 = 0;
  AixLog::operator<<((ostream *)&local_1e0,(Timestamp *)pTVar32);
  local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"alloc_transient_reg","");
  pp_Var19 = (_func_int **)(local_258 + 0x10);
  pcVar31 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_258._0_8_ = pp_Var19;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_258,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,"");
  local_1b8._0_4_ = 0x1edf10;
  local_1b8._4_4_ = 0;
  local_1b8._8_8_ = local_278.__lhs;
  if ((_Variadic_union<arm::RegisterOperand,_short> *)local_278.__lhs == &local_268) {
    local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._16_8_ = local_268._8_8_;
    local_1b8._8_8_ = (undefined1 *)((long)&local_1a8 + 8);
  }
  local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
  super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._9_7_ = local_268._1_7_;
  local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
  super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._8_1_ = local_268._M_rest._0_1_;
  local_190._M_p = &local_180;
  local_1a8.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
  super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_first._M_storage.
  super_Displayable._vptr_Displayable = (Displayable)(Displayable)local_270;
  local_270 = 0;
  local_268._M_rest._M_first._M_storage._0_1_ = 0;
  if ((_func_int **)local_258._0_8_ == pp_Var19) {
    uStack_178 = local_258._24_8_;
  }
  else {
    local_190._M_p = (pointer)local_258._0_8_;
  }
  uStack_17f = local_258._17_7_;
  local_180 = local_258[0x10];
  local_188 = (pointer)local_258._8_8_;
  local_258._8_8_ = (pointer)0x0;
  local_258[0x10] = 0;
  local_170 = 0x260;
  local_168 = false;
  local_278.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_268;
  local_258._0_8_ = pp_Var19;
  AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"-> ",3);
  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_1b8);
  if ((_func_int **)local_258._0_8_ != pp_Var19) {
    operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
  }
  if ((_Variadic_union<arm::RegisterOperand,_short> *)local_278.__lhs != &local_268) {
    operator_delete(local_278.__lhs,
                    CONCAT71(local_268._1_7_,local_268._M_rest._M_first._M_storage._0_1_) + 1);
  }
  local_230 = &PTR__Tag_001edee0;
  if (local_228 != pRVar4) {
    operator_delete(local_228,CONCAT71(local_220._9_7_,local_220._M_first._M_storage.reg._0_1_) + 1)
    ;
  }
  display_active_regs(this);
  return (Reg)uVar26;
}

Assistant:

Reg RegAllocator::alloc_transient_reg(Interval i, std::optional<Reg> orig) {
  Reg r = -1;
  if (orig) {
    LOG(TRACE) << "orig ";
    display_reg_name(LOG(TRACE), orig.value());
    LOG(TRACE) << " ";
    auto it = active_reg_map.begin();
    while (it != active_reg_map.end()) {
      if (it->first == orig)
        break;
      else
        it++;
    }
    if (it != active_reg_map.end()) {
      LOG(TRACE) << "r-> " << it->second << std::endl;
      auto r = it->second;
      auto x = *it;
      active_reg_map.erase(it);
      active_reg_map.push_back(x);
      return r;
    }
  }
  auto alloc_using_temp = [&]() {
    if (r == -1) {
      for (auto reg : TEMP_REGS) {
        if (active.find(reg) == active.end()) {
          r = reg;
          break;
        }
      }
    }
  };
  auto alloc_using_glob = [&]() {
    if (r == -1) {
      for (auto reg : GLOB_REGS) {
        if (active.find(reg) == active.end() &&
            used_regs.find(reg) == used_regs.end()) {
          r = reg;
          used_regs_temp.insert(reg);
          break;
        }
      }
    }
  };
  {
    auto lower_bound = bl_points.lower_bound(i.start);
    auto upper_bound = bl_points.upper_bound(i.end);
    if (lower_bound != upper_bound) {
      // Cross-BL virtual register
      alloc_using_glob();
      alloc_using_temp();
    } else {
      // non-cross-bl virtual register
      alloc_using_temp();
      alloc_using_glob();
    }
  }
  if (r == -1) {
    // Choose a value in active to spill.
    // NOTE: the current algorithm chooses the earliest-allocated register
    if (active_reg_map.size() == 0) {
      std::stringstream ss;
      ss << "Failed to allocate: all active registers are "
            "temporary!"
         << std::endl
         << "Dump: " << std::endl;

      for (auto [k, v] : active) {
        display_reg_name(ss, k);
        ss << ": [" << v.start << ", " << v.end << "]" << std::endl;
      }

      throw std::runtime_error(ss.str());
    }
    auto [spill_virt, spill_phys] = active_reg_map.front();
    active_reg_map.pop_front();
    auto interval = active.at(spill_phys);
    interval.start = i.start;
    int spill_pos = get_or_alloc_spill_pos(spill_virt);
    // TODO: move this into a separate function
    inst_sink.push_back(std::make_unique<LoadStoreInst>(
        OpCode::StR, spill_phys,
        MemoryOperand(REG_SP, spill_pos + stack_offset), cur_cond));

    auto &trace = LOG(TRACE);
    trace << "Spilling: ";
    display_reg_name(trace, spill_phys);
    trace << " -> ";
    display_reg_name(trace, spill_virt);
    trace << " -> " << spill_pos << " ";

    r = spill_phys;
    spilled_regs.insert({spill_virt, interval});
    {
      auto it = active_reg_map.begin();
      while (it != active_reg_map.end()) {
        if (it->first == orig) {
          active_reg_map.erase(it);
          break;
        } else
          it++;
      }
    }
    active.erase(spill_phys);
  }
  this->active.insert({r, i});
  if (orig) {
    this->active_reg_map.push_back({orig.value(), r});
  }
  LOG(TRACE) << "-> " << r << std::endl;
  display_active_regs();
  return r;
}